

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savefile.c
# Opt level: O2

void sf_put(uint8_t v)

{
  ulong uVar1;
  
  if (buffer == (uint8_t *)0x0) {
    __assert_fail("buffer != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/savefile.c"
                  ,0xc0,"void sf_put(uint8_t)");
  }
  if (buffer_size != 0) {
    if (buffer_size == buffer_pos) {
      buffer_size = buffer_size + 0x400;
      buffer = (uint8_t *)mem_realloc(buffer,(ulong)buffer_size);
    }
    if (buffer_pos < buffer_size) {
      uVar1 = (ulong)buffer_pos;
      buffer_pos = buffer_pos + 1;
      buffer[uVar1] = v;
      buffer_check = buffer_check + v;
      return;
    }
    __assert_fail("buffer_pos < buffer_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/savefile.c"
                  ,0xc9,"void sf_put(uint8_t)");
  }
  __assert_fail("buffer_size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/savefile.c"
                ,0xc1,"void sf_put(uint8_t)");
}

Assistant:

static void sf_put(uint8_t v)
{
	assert(buffer != NULL);
	assert(buffer_size > 0);

	if (buffer_size == buffer_pos)
	{
		buffer_size += BUFFER_BLOCK_INCREMENT;
		buffer = mem_realloc(buffer, buffer_size);
	}

	assert(buffer_pos < buffer_size);

	buffer[buffer_pos++] = v;
	buffer_check += v;
}